

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3PcacheMove(PgHdr *p,Pgno newPgno)

{
  PCache *pPVar1;
  PgHdr *p_00;
  sqlite3_pcache_page *psVar2;
  PgHdr *pXPage;
  sqlite3_pcache_page *pOther;
  PCache *pCache;
  Pgno newPgno_local;
  PgHdr *p_local;
  
  pPVar1 = p->pCache;
  psVar2 = (*sqlite3Config.pcache2.xFetch)(pPVar1->pCache,newPgno,0);
  if (psVar2 != (sqlite3_pcache_page *)0x0) {
    p_00 = (PgHdr *)psVar2->pExtra;
    p_00->nRef = p_00->nRef + 1;
    pPVar1->nRefSum = pPVar1->nRefSum + 1;
    sqlite3PcacheDrop(p_00);
  }
  (*sqlite3Config.pcache2.xRekey)(pPVar1->pCache,p->pPage,p->pgno,newPgno);
  p->pgno = newPgno;
  if (((p->flags & 2) != 0) && ((p->flags & 8) != 0)) {
    pcacheManageDirtyList(p,'\x03');
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3PcacheMove(PgHdr *p, Pgno newPgno){
  PCache *pCache = p->pCache;
  sqlite3_pcache_page *pOther;
  assert( p->nRef>0 );
  assert( newPgno>0 );
  assert( sqlite3PcachePageSanity(p) );
  pcacheTrace(("%p.MOVE %d -> %d\n",pCache,p->pgno,newPgno));
  pOther = sqlite3GlobalConfig.pcache2.xFetch(pCache->pCache, newPgno, 0);
  if( pOther ){
    PgHdr *pXPage = (PgHdr*)pOther->pExtra;
    assert( pXPage->nRef==0 );
    pXPage->nRef++;
    pCache->nRefSum++;
    sqlite3PcacheDrop(pXPage);
  }
  sqlite3GlobalConfig.pcache2.xRekey(pCache->pCache, p->pPage, p->pgno,newPgno);
  p->pgno = newPgno;
  if( (p->flags&PGHDR_DIRTY) && (p->flags&PGHDR_NEED_SYNC) ){
    pcacheManageDirtyList(p, PCACHE_DIRTYLIST_FRONT);
    assert( sqlite3PcachePageSanity(p) );
  }
}